

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O2

void test_33(QPDF *pdf,char *arg2)

{
  FILE *__s;
  void *__ptr;
  size_t __size;
  QPDFWriter w;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  shared_ptr<Buffer> b;
  Pl_Buffer p;
  
  Pl_Buffer::Pl_Buffer(&p,"buffer",(Pipeline *)0x0);
  QPDFWriter::QPDFWriter(&w,pdf);
  QPDFWriter::setStaticID(SUB81(&w,0));
  QPDFWriter::setOutputPipeline((Pipeline *)&w);
  QPDFWriter::write();
  Pl_Buffer::getBufferSharedPointer();
  __s = (FILE *)QUtil::safe_fopen("a.pdf","wb");
  __ptr = (void *)Buffer::getBuffer();
  __size = Buffer::getSize();
  fwrite(__ptr,__size,1,__s);
  fclose(__s);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&b.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60);
  Pl_Buffer::~Pl_Buffer(&p);
  return;
}

Assistant:

static void
test_33(QPDF& pdf, char const* arg2)
{
    // Test writing to a custom pipeline
    Pl_Buffer p("buffer");
    QPDFWriter w(pdf);
    w.setStaticID(true);
    w.setOutputPipeline(&p);
    w.write();
    auto b = p.getBufferSharedPointer();
    FILE* f = QUtil::safe_fopen("a.pdf", "wb");
    fwrite(b->getBuffer(), b->getSize(), 1, f);
    fclose(f);
}